

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlElement::ClearThis(TiXmlElement *this)

{
  TiXmlAttribute *pTVar1;
  TiXmlAttribute *node;
  TiXmlElement *this_local;
  
  TiXmlNode::Clear(&this->super_TiXmlNode);
  while (pTVar1 = TiXmlAttributeSet::First(&this->attributeSet), pTVar1 != (TiXmlAttribute *)0x0) {
    pTVar1 = TiXmlAttributeSet::First(&this->attributeSet);
    TiXmlAttributeSet::Remove(&this->attributeSet,pTVar1);
    if (pTVar1 != (TiXmlAttribute *)0x0) {
      (*(pTVar1->super_TiXmlBase)._vptr_TiXmlBase[1])();
    }
  }
  return;
}

Assistant:

void TiXmlElement::ClearThis() {
	Clear();
	while (attributeSet.First()) {
		TiXmlAttribute* node = attributeSet.First();
		attributeSet.Remove(node);
		delete node;
	}
}